

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_sinh_detail.hpp
# Opt level: O0

void __thiscall
boost::math::quadrature::detail::
tanh_sinh_detail<float,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
::extend_refinements
          (tanh_sinh_detail<float,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
           *this)

{
  uint uVar1;
  int iVar2;
  ulong __n;
  reference pvVar3;
  reference __x;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *in_RDI;
  pointer *this_00;
  float fVar4;
  undefined4 uVar5;
  double dVar6;
  float pos_1;
  float pos;
  size_t n;
  size_t first_complement;
  float h;
  size_t row;
  scoped_lock guard;
  memory_order __b_1;
  memory_order __b;
  lightweight_mutex *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff38;
  float fVar7;
  float local_88;
  float local_80;
  value_type local_70;
  
  boost::detail::lightweight_mutex::scoped_lock::scoped_lock
            ((scoped_lock *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  if ((pointer)(ulong)*(uint *)&in_RDI[3].
                                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage <
      in_RDI[3].
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = &in_RDI[3].
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__atomic_base<unsigned_int>::operator++((__atomic_base<unsigned_int> *)this_00);
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    uVar1 = *(uint *)this_00;
    __n = (ulong)uVar1;
    dVar6 = std::ldexp(5.26354424712089e-315,-uVar1);
    fVar4 = SUB84(dVar6,0);
    local_70 = 0;
    fVar7 = fVar4;
    dVar6 = std::ceil((double)(ulong)(uint)((*(float *)&in_RDI[5].
                                                                                                                
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - fVar4) / (fVar4 + fVar4)));
    uVar5 = SUB84(dVar6,0);
    iVar2 = itrunc<float>((float *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::operator[](in_RDI,__n);
    std::vector<float,_std::allocator<float>_>::reserve
              ((vector<float,_std::allocator<float>_> *)CONCAT44(fVar7,uVar5),
               CONCAT44(iVar2,in_stack_ffffffffffffff38));
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::operator[](in_RDI + 1,__n);
    std::vector<float,_std::allocator<float>_>::reserve
              ((vector<float,_std::allocator<float>_> *)CONCAT44(fVar7,uVar5),
               CONCAT44(iVar2,in_stack_ffffffffffffff38));
    for (local_80 = fVar4;
        local_80 <
        *(float *)&in_RDI[5].
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_80 = fVar4 + fVar4 + local_80) {
      if (local_80 <
          *(float *)((long)&in_RDI[5].
                            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) {
        local_70 = local_70 + 1;
      }
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[](in_RDI,__n);
      if (*(float *)((long)&in_RDI[5].
                            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) <= local_80) {
        abscissa_complement_at_t
                  ((float *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      }
      else {
        abscissa_at_t((float *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      }
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)
                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (value_type *)in_stack_ffffffffffffff08);
    }
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 2),__n);
    *pvVar3 = local_70;
    for (local_88 = fVar4;
        local_88 <
        *(float *)&in_RDI[5].
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_88 = fVar4 + fVar4 + local_88) {
      __x = std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::operator[](in_RDI + 1,__n);
      in_stack_ffffffffffffff14 =
           weight_at_t((float *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)
                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),(value_type *)__x);
    }
  }
  boost::detail::lightweight_mutex::scoped_lock::~scoped_lock((scoped_lock *)0x11ed0a);
  return;
}

Assistant:

void extend_refinements()const
   {
#ifndef BOOST_MATH_NO_ATOMIC_INT
      boost::detail::lightweight_mutex::scoped_lock guard(m_mutex);
#endif
      //
      // Check some other thread hasn't got here after we read the atomic variable, but before we got here:
      //
#ifndef BOOST_MATH_NO_ATOMIC_INT
      if (m_committed_refinements.load() >= m_max_refinements)
         return;
#else
      if (m_committed_refinements >= m_max_refinements)
         return;
#endif

      using std::ldexp;
      using std::ceil;
      ++m_committed_refinements;
#ifndef BOOST_MATH_NO_ATOMIC_INT
      std::size_t row = m_committed_refinements.load();
#else
      std::size_t row = m_committed_refinements;
#endif
      Real h = ldexp(Real(1), -static_cast<int>(row));
      std::size_t first_complement = 0;
      std::size_t n = boost::math::itrunc(ceil((m_t_max - h) / (2 * h)));
      m_abscissas[row].reserve(n);
      m_weights[row].reserve(n);
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
      {
         if (pos < m_t_crossover)
            ++first_complement;
         m_abscissas[row].push_back(pos < m_t_crossover ? abscissa_at_t(pos) : -abscissa_complement_at_t(pos));
      }
      m_first_complements[row] = first_complement;
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
         m_weights[row].push_back(weight_at_t(pos));
   }